

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::BlockedPumpTo::close(BlockedPumpTo *this,int __fd)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined2 in_DX;
  undefined4 in_register_00000034;
  long lVar2;
  undefined8 in_R8;
  Promise<void> local_58 [2];
  Fault local_38;
  Fault f;
  uint16_t code_local;
  BlockedPumpTo *this_local;
  StringPtr reason_local;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  f.exception._6_2_ = in_DX;
  bVar1 = Canceler::isEmpty((Canceler *)(lVar2 + 0x20));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xb91,FAILED,"canceler.isEmpty()","\"another message send is already in progress\"",
               (char (*) [44])"another message send is already in progress");
    _::Debug::Fault::fatal(&local_38);
  }
  (**(code **)(**(long **)(lVar2 + 0x18) + 0x10))
            (local_58,*(long **)(lVar2 + 0x18),f.exception._6_2_,in_RCX,in_R8);
  Canceler::wrap<void>((Canceler *)this,(Promise<void> *)(lVar2 + 0x20));
  Promise<void>::~Promise(local_58);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      KJ_REQUIRE(canceler.isEmpty(), "another message send is already in progress");
      return canceler.wrap(output.close(code, reason));
    }